

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump2XYZ.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  double *pdVar2;
  Snapshot *this;
  char *pcVar3;
  size_type sVar4;
  uint i;
  int iVar5;
  long *plVar6;
  SimInfo *info;
  CompositeVisitor *this_00;
  BaseVisitor *pBVar7;
  WaterTypeVisitor *this_01;
  AtomNameVisitor *this_02;
  ZConsVisitor *this_03;
  ReplicateVisitor *this_04;
  LipidTransVisitor *this_05;
  PrepareVisitor *this_06;
  DumpReader *pDVar8;
  Molecule *pMVar9;
  long lVar10;
  pointer ppSVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  StuntDouble *pSVar13;
  uint i_1;
  pointer ppRVar14;
  uint uVar15;
  ulong uVar16;
  RigidBody *this_07;
  MoleculeIterator miter;
  Vector<double,_3U> result;
  SimCreator creator;
  Vector3d molCom;
  string xyzFileName;
  string dumpFileName;
  Vector3d newMolCom;
  Vector3d displacement;
  gengetopt_args_info args_info;
  ofstream xyzStream;
  XYZVisitor *local_5a0;
  MoleculeIterator local_598;
  int local_58c;
  ForceManager *local_588;
  int local_57c;
  Vector3d local_578;
  SimCreator local_560;
  string local_538;
  _func_int **local_518;
  DumpReader *local_510;
  char *local_508;
  char *local_500;
  char local_4f8;
  undefined7 uStack_4f7;
  string local_4e8;
  Vector3d local_4c8;
  pointer local_4a8;
  double dStack_4a0;
  double local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_488;
  ulong local_480;
  double local_478 [4];
  Vector3i local_458;
  gengetopt_args_info local_448;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  local_508 = &local_4f8;
  local_500 = (char *)0x0;
  local_4f8 = '\0';
  iVar5 = cmdline_parser(argc,argv,&local_448);
  sVar4 = local_4e8._M_string_length;
  if (iVar5 != 0) {
    exit(1);
  }
  if (local_448.input_given == 0) {
    builtin_strncpy(painCave.errMsg,"No input file name was specified.\n",0x23);
    painCave.isFatal = 1;
    simError();
  }
  else {
    strlen(local_448.input_arg);
    std::__cxx11::string::_M_replace((ulong)&local_4e8,0,(char *)sVar4,(ulong)local_448.input_arg);
  }
  pcVar3 = local_500;
  if (local_448.output_given == 0) {
    std::__cxx11::string::_M_assign((string *)&local_508);
    std::__cxx11::string::rfind((char *)&local_508,0x25c848,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_560,(ulong)&local_508);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_560);
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar12) {
      local_220[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_220[0]._8_8_ = plVar6[3];
      local_230 = (undefined1  [8])local_220;
    }
    else {
      local_220[0]._0_8_ = paVar12->_M_allocated_capacity;
      local_230 = (undefined1  [8])*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)paVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_508,(string *)local_230);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
    if (local_560._vptr_SimCreator != (_func_int **)&local_560.mdFileName_._M_string_length) {
      operator_delete(local_560._vptr_SimCreator,local_560.mdFileName_._M_string_length + 1);
    }
  }
  else {
    strlen(local_448.output_arg);
    std::__cxx11::string::_M_replace((ulong)&local_508,0,pcVar3,(ulong)local_448.output_arg);
  }
  local_560.mdFileName_._M_dataplus._M_p = (pointer)&local_560.mdFileName_.field_2;
  local_518 = (_func_int **)&PTR__SimCreator_002ba7d0;
  local_560._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002ba7d0;
  local_560.mdFileName_._M_string_length = 0;
  local_560.mdFileName_.field_2._M_local_buf[0] = '\0';
  info = OpenMD::SimCreator::createSim(&local_560,&local_4e8,false);
  local_588 = (ForceManager *)operator_new(0xc80);
  OpenMD::ForceManager::ForceManager(local_588,info);
  this_00 = (CompositeVisitor *)operator_new(0x40);
  OpenMD::CompositeVisitor::CompositeVisitor(this_00);
  if (local_448.rigidbody_flag != 0) {
    pBVar7 = (BaseVisitor *)operator_new(0x30);
    OpenMD::RBCOMVisitor::RBCOMVisitor((RBCOMVisitor *)pBVar7,info);
    OpenMD::CompositeVisitor::addVisitor(this_00,pBVar7,900);
  }
  pBVar7 = (BaseVisitor *)operator_new(0x78);
  OpenMD::SSDAtomVisitor::SSDAtomVisitor((SSDAtomVisitor *)pBVar7,info);
  OpenMD::CompositeVisitor::addVisitor(this_00,pBVar7,800);
  pBVar7 = (BaseVisitor *)operator_new(0x78);
  OpenMD::GBtailVisitor::GBtailVisitor((GBtailVisitor *)pBVar7,info);
  OpenMD::CompositeVisitor::addVisitor(this_00,pBVar7,0x316);
  pBVar7 = (BaseVisitor *)operator_new(0x78);
  OpenMD::GBheadVisitor::GBheadVisitor((GBheadVisitor *)pBVar7,info);
  OpenMD::CompositeVisitor::addVisitor(this_00,pBVar7,0x315);
  pBVar7 = (BaseVisitor *)operator_new(0x38);
  OpenMD::DefaultAtomVisitor::DefaultAtomVisitor((DefaultAtomVisitor *)pBVar7,info);
  OpenMD::CompositeVisitor::addVisitor(this_00,pBVar7,700);
  if ((local_448.water_given == 0) && (local_448.watertype_flag != 0)) {
    this_01 = (WaterTypeVisitor *)operator_new(0x58);
    OpenMD::WaterTypeVisitor::WaterTypeVisitor(this_01);
    OpenMD::CompositeVisitor::addVisitor(this_00,(BaseVisitor *)this_01,600);
  }
  if (local_448.basetype_flag != 0) {
    this_02 = (AtomNameVisitor *)operator_new(0x38);
    OpenMD::AtomNameVisitor::AtomNameVisitor(this_02,info);
    OpenMD::CompositeVisitor::addVisitor(this_00,(BaseVisitor *)this_02,0x226);
  }
  if (local_448.zconstraint_flag != 0) {
    this_03 = (ZConsVisitor *)operator_new(0xe8);
    OpenMD::ZConsVisitor::ZConsVisitor(this_03,info);
    if ((this_03->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (*(this_03->super_BaseVisitor)._vptr_BaseVisitor[1])(this_03);
    }
    else {
      OpenMD::CompositeVisitor::addVisitor(this_00,(BaseVisitor *)this_03,500);
    }
  }
  if (((local_448.repeatX_given != 0) || (local_448.repeatY_given != 0)) ||
     (local_448.repeatZ_given != 0)) {
    this_04 = (ReplicateVisitor *)operator_new(0x58);
    local_458.super_Vector<int,_3U>.data_[2] = local_448.repeatZ_arg;
    OpenMD::ReplicateVisitor::ReplicateVisitor(this_04,info,&local_458);
    OpenMD::CompositeVisitor::addVisitor(this_00,(BaseVisitor *)this_04,300);
  }
  if (local_448.originsele_given == 0 || local_448.refsele_given == 0) {
    if (local_448.refsele_given != 0 || local_448.originsele_given != 0) {
      memcpy(&painCave,"The --refsele and --originsele arguments should appear together.\n",0x42);
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    this_05 = (LipidTransVisitor *)operator_new(0xcd0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,local_448.originsele_arg,(allocator<char> *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_538,local_448.refsele_arg,(allocator<char> *)&local_4a8);
    OpenMD::LipidTransVisitor::LipidTransVisitor(this_05,info,(string *)local_230,&local_538);
    OpenMD::CompositeVisitor::addVisitor(this_00,(BaseVisitor *)this_05,0xfa);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
  }
  if (local_448.selection_given == 0) {
    local_5a0 = (XYZVisitor *)operator_new(0x668);
    OpenMD::XYZVisitor::XYZVisitor(local_5a0,info);
  }
  else {
    local_5a0 = (XYZVisitor *)operator_new(0x668);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_230,local_448.selection_arg,(allocator<char> *)&local_538);
    OpenMD::XYZVisitor::XYZVisitor(local_5a0,info,(string *)local_230);
    if (local_230 != (undefined1  [8])local_220) {
      operator_delete((void *)local_230,local_220[0]._M_allocated_capacity + 1);
    }
  }
  if (local_448.velocities_flag != 0) {
    local_5a0->doVelocities_ = true;
  }
  local_57c = local_448.forces_flag;
  if (local_448.forces_flag != 0) {
    local_5a0->doForces_ = true;
  }
  if (local_448.vectors_flag != 0) {
    local_5a0->doVectors_ = true;
  }
  if (local_448.charges_flag != 0) {
    local_5a0->doCharges_ = true;
  }
  if (local_448.efield_flag != 0) {
    local_5a0->doElectricFields_ = true;
  }
  if (local_448.globalID_flag != 0) {
    local_5a0->doGlobalIDs_ = true;
  }
  OpenMD::CompositeVisitor::addVisitor(this_00,&local_5a0->super_BaseVisitor,200);
  this_06 = (PrepareVisitor *)operator_new(0x28);
  OpenMD::PrepareVisitor::PrepareVisitor(this_06);
  pDVar8 = (DumpReader *)operator_new(0x1258);
  OpenMD::DumpReader::DumpReader(pDVar8,info,&local_4e8);
  local_510 = pDVar8;
  local_58c = OpenMD::DumpReader::getNFrames(pDVar8);
  std::ofstream::ofstream(local_230,local_508,_S_out);
  uVar16 = 0;
  local_598._M_node = (_Base_ptr)0x0;
  local_538.field_2._M_allocated_capacity = 0;
  local_538._M_dataplus._M_p = (pointer)0x0;
  local_538._M_string_length = 0;
  local_4c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_4c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_4c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_498 = 0.0;
  local_4a8 = (pointer)0x0;
  dStack_4a0 = 0.0;
  if (0 < local_58c) {
    local_488 = &local_5a0->frame;
    do {
      local_480 = uVar16;
      OpenMD::DumpReader::readFrame(local_510,(int)uVar16);
      if (local_57c != 0) {
        (*local_588->_vptr_ForceManager[2])();
      }
      if (local_448.periodicBox_flag != 0) {
        this = info->sman_->currentSnapshot_;
        pMVar9 = OpenMD::SimInfo::beginMolecule(info,&local_598);
        while (pMVar9 != (Molecule *)0x0) {
          OpenMD::Molecule::getCom(&local_578,pMVar9);
          local_538.field_2._M_allocated_capacity =
               (size_type)local_578.super_Vector<double,_3U>.data_[2];
          local_538._M_dataplus._M_p = (pointer)local_578.super_Vector<double,_3U>.data_[0];
          local_538._M_string_length = (size_type)local_578.super_Vector<double,_3U>.data_[1];
          local_4c8.super_Vector<double,_3U>.data_[0] = local_578.super_Vector<double,_3U>.data_[0];
          local_4c8.super_Vector<double,_3U>.data_[1] = local_578.super_Vector<double,_3U>.data_[1];
          local_4c8.super_Vector<double,_3U>.data_[2] = local_578.super_Vector<double,_3U>.data_[2];
          OpenMD::Snapshot::wrapVector(this,&local_4c8);
          local_578.super_Vector<double,_3U>.data_[0] = 0.0;
          local_578.super_Vector<double,_3U>.data_[1] = 0.0;
          local_578.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar10 = 0;
          do {
            local_578.super_Vector<double,_3U>.data_[lVar10] =
                 local_4c8.super_Vector<double,_3U>.data_[lVar10] -
                 (double)(&local_538._M_dataplus)[lVar10]._M_p;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_498 = local_578.super_Vector<double,_3U>.data_[2];
          local_4a8 = (pointer)local_578.super_Vector<double,_3U>.data_[0];
          dStack_4a0 = local_578.super_Vector<double,_3U>.data_[1];
          ppSVar11 = (pMVar9->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (ppSVar11 ==
                (pMVar9->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pSVar13 = (StuntDouble *)0x0;
            }
            else {
              pSVar13 = *ppSVar11;
            }
            if (pSVar13 == (StuntDouble *)0x0) break;
            lVar10 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_)
            ;
            local_578.super_Vector<double,_3U>.data_[2] =
                 *(double *)(lVar10 + 0x10 + (long)pSVar13->localIndex_ * 0x18);
            puVar1 = (undefined8 *)(lVar10 + (long)pSVar13->localIndex_ * 0x18);
            local_578.super_Vector<double,_3U>.data_[0] = (double)*puVar1;
            local_578.super_Vector<double,_3U>.data_[1] = (double)puVar1[1];
            local_478[0] = 0.0;
            local_478[1] = 0.0;
            local_478[2] = 0.0;
            lVar10 = 0;
            do {
              local_478[lVar10] =
                   local_578.super_Vector<double,_3U>.data_[lVar10] + (double)(&local_4a8)[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            iVar5 = pSVar13->localIndex_;
            lVar10 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_)
            ;
            *(double *)(lVar10 + 0x10 + (long)iVar5 * 0x18) = local_478[2];
            pdVar2 = (double *)(lVar10 + (long)iVar5 * 0x18);
            *pdVar2 = local_478[0];
            pdVar2[1] = local_478[1];
            ppSVar11 = ppSVar11 + 1;
          }
          pMVar9 = OpenMD::SimInfo::nextMolecule(info,&local_598);
        }
      }
      pMVar9 = OpenMD::SimInfo::beginMolecule(info,&local_598);
      while (pMVar9 != (Molecule *)0x0) {
        ppRVar14 = (pMVar9->rigidBodies_).
                   super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (ppRVar14 ==
            (pMVar9->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this_07 = (RigidBody *)0x0;
        }
        else {
          this_07 = *ppRVar14;
        }
        while (this_07 != (RigidBody *)0x0) {
          ppRVar14 = ppRVar14 + 1;
          OpenMD::RigidBody::updateAtoms(this_07);
          if (local_448.velocities_flag != 0) {
            OpenMD::RigidBody::updateAtomVel(this_07);
          }
          if (ppRVar14 ==
              (pMVar9->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_07 = (RigidBody *)0x0;
          }
          else {
            this_07 = *ppRVar14;
          }
        }
        pMVar9 = OpenMD::SimInfo::nextMolecule(info,&local_598);
      }
      pMVar9 = OpenMD::SimInfo::beginMolecule(info,&local_598);
      while (pMVar9 != (Molecule *)0x0) {
        ppSVar11 = (pMVar9->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppSVar11 ==
            (pMVar9->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar13 = (StuntDouble *)0x0;
        }
        else {
          pSVar13 = *ppSVar11;
        }
        while (pSVar13 != (StuntDouble *)0x0) {
          ppSVar11 = ppSVar11 + 1;
          (*pSVar13->_vptr_StuntDouble[9])(pSVar13,this_06);
          if (ppSVar11 ==
              (pMVar9->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar13 = (StuntDouble *)0x0;
          }
          else {
            pSVar13 = *ppSVar11;
          }
        }
        pMVar9 = OpenMD::SimInfo::nextMolecule(info,&local_598);
      }
      (*(this_00->super_BaseVisitor)._vptr_BaseVisitor[9])(this_00);
      pMVar9 = OpenMD::SimInfo::beginMolecule(info,&local_598);
      while (pMVar9 != (Molecule *)0x0) {
        ppSVar11 = (pMVar9->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppSVar11 ==
            (pMVar9->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar13 = (StuntDouble *)0x0;
        }
        else {
          pSVar13 = *ppSVar11;
        }
        while (pSVar13 != (StuntDouble *)0x0) {
          ppSVar11 = ppSVar11 + 1;
          (*pSVar13->_vptr_StuntDouble[9])(pSVar13,this_00);
          if (ppSVar11 ==
              (pMVar9->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar13 = (StuntDouble *)0x0;
          }
          else {
            pSVar13 = *ppSVar11;
          }
        }
        pMVar9 = OpenMD::SimInfo::nextMolecule(info,&local_598);
      }
      OpenMD::XYZVisitor::writeFrame(local_5a0,(ostream *)local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(local_488,
                        (local_488->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
      uVar15 = (int)local_480 + local_448.frame_arg;
      uVar16 = (ulong)uVar15;
    } while ((int)uVar15 < local_58c);
  }
  std::ofstream::close();
  (*local_588->_vptr_ForceManager[1])();
  (*(this_00->super_BaseVisitor)._vptr_BaseVisitor[1])(this_00);
  (*(this_06->super_BaseVisitor)._vptr_BaseVisitor[1])(this_06);
  pDVar8 = local_510;
  OpenMD::DumpReader::~DumpReader(local_510);
  operator_delete(pDVar8,0x1258);
  if (info != (SimInfo *)0x0) {
    (*info->_vptr_SimInfo[1])();
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  local_560._vptr_SimCreator = local_518;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.mdFileName_._M_dataplus._M_p != &local_560.mdFileName_.field_2) {
    operator_delete(local_560.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_560.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_560.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,CONCAT71(uStack_4f7,local_4f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,
                    CONCAT71(local_4e8.field_2._M_allocated_capacity._1_7_,
                             local_4e8.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  string dumpFileName;
  string xyzFileName;

  bool printVel(false);
  bool printFrc(false);
  bool printVec(false);
  bool printChrg(false);
  bool printField(false);
  bool printGlobalID(false);

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  if (args_info.input_given) {
    dumpFileName = args_info.input_arg;
  } else {
    strcpy(painCave.errMsg, "No input file name was specified.\n");
    painCave.isFatal = 1;
    simError();
  }

  if (args_info.output_given) {
    xyzFileName = args_info.output_arg;
  } else {
    xyzFileName = dumpFileName;
    xyzFileName = xyzFileName.substr(0, xyzFileName.rfind(".")) + ".xyz";
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info          = creator.createSim(dumpFileName, false);
  ForceManager* forceMan = new ForceManager(info);

  // create visitor list
  CompositeVisitor* compositeVisitor = new CompositeVisitor();

  // create RigidBody Visitor
  if (args_info.rigidbody_flag) {
    RBCOMVisitor* rbCOMVisitor = new RBCOMVisitor(info);
    compositeVisitor->addVisitor(rbCOMVisitor, 900);
  }

  // create SSD atom visitor
  SSDAtomVisitor* ssdVisitor = new SSDAtomVisitor(info);
  compositeVisitor->addVisitor(ssdVisitor, 800);

  // create GBtail atom visitor
  GBtailVisitor* gbtVisitor = new GBtailVisitor(info);
  compositeVisitor->addVisitor(gbtVisitor, 790);

  // create GBhead atom visitor
  GBheadVisitor* gbhVisitor = new GBheadVisitor(info);
  compositeVisitor->addVisitor(gbhVisitor, 789);

  // create default atom visitor
  DefaultAtomVisitor* defaultAtomVisitor = new DefaultAtomVisitor(info);
  compositeVisitor->addVisitor(defaultAtomVisitor, 700);

  // if we gave the -w option, we want to skip the waters:
  if (!args_info.water_given) {
    // create waterType visitor
    if (args_info.watertype_flag) {
      WaterTypeVisitor* waterTypeVisitor = new WaterTypeVisitor;
      compositeVisitor->addVisitor(waterTypeVisitor, 600);
    }
  }

  if (args_info.basetype_flag) {
    AtomNameVisitor* atomNameVisitor = new AtomNameVisitor(info);
    compositeVisitor->addVisitor(atomNameVisitor, 550);
    // When debugging visitors, you may find this helpful:
    //    cout << compositeVisitor->toString();
  }

  // create ZconsVisitor
  if (args_info.zconstraint_flag) {
    ZConsVisitor* zconsVisitor = new ZConsVisitor(info);

    if (zconsVisitor->haveZconsMol()) {
      compositeVisitor->addVisitor(zconsVisitor, 500);
    } else {
      delete zconsVisitor;
    }
  }

  // create wrapping visitor

  // if(args_info.periodicBox_flag){
  //  WrappingVisitor* wrappingVisitor = new WrappingVisitor(info);
  //  compositeVisitor->addVisitor(wrappingVisitor, 400);
  //}

  // create replicate visitor
  if (args_info.repeatX_given > 0 || args_info.repeatY_given > 0 ||
      args_info.repeatZ_given > 0) {
    Vector3i replicateOpt(args_info.repeatX_arg, args_info.repeatY_arg,
                          args_info.repeatZ_arg);
    ReplicateVisitor* replicateVisitor =
        new ReplicateVisitor(info, replicateOpt);
    compositeVisitor->addVisitor(replicateVisitor, 300);
  }

  // create rotation visitor
  if (args_info.refsele_given && args_info.originsele_given) {
    compositeVisitor->addVisitor(
        new LipidTransVisitor(info, args_info.originsele_arg,
                              args_info.refsele_arg),
        250);
  } else if (args_info.refsele_given || args_info.originsele_given) {
    strcpy(
        painCave.errMsg,
        "The --refsele and --originsele arguments should appear together.\n");
    painCave.isFatal = 1;
    simError();
  }

  // create xyzVisitor
  XYZVisitor* xyzVisitor;

  if (args_info.selection_given) {
    xyzVisitor = new XYZVisitor(info, args_info.selection_arg);
  } else {
    xyzVisitor = new XYZVisitor(info);
  }

  if (args_info.velocities_flag) {
    printVel = true;
    xyzVisitor->doVelocities(printVel);
  }
  if (args_info.forces_flag) {
    printFrc = true;
    xyzVisitor->doForces(printFrc);
  }
  if (args_info.vectors_flag) {
    printVec = true;
    xyzVisitor->doVectors(printVec);
  }
  if (args_info.charges_flag) {
    printChrg = true;
    xyzVisitor->doCharges(printChrg);
  }
  if (args_info.efield_flag) {
    printField = true;
    xyzVisitor->doElectricFields(printField);
  }
  if (args_info.globalID_flag) {
    printGlobalID = true;
    xyzVisitor->doGlobalIDs(printGlobalID);
  }

  compositeVisitor->addVisitor(xyzVisitor, 200);

  // create prepareVisitor
  PrepareVisitor* prepareVisitor = new PrepareVisitor();

  // open dump file
  DumpReader* dumpReader = new DumpReader(info, dumpFileName);
  int nframes            = dumpReader->getNFrames();

  ofstream xyzStream(xyzFileName.c_str());

  SimInfo::MoleculeIterator miter;
  Molecule::IntegrableObjectIterator iiter;
  Molecule::RigidBodyIterator rbIter;
  Molecule* mol;
  StuntDouble* sd;
  RigidBody* rb;
  Vector3d molCom;
  Vector3d newMolCom;
  Vector3d displacement;
  Mat3x3d hmat;
  Snapshot* currentSnapshot;

  for (int i = 0; i < nframes; i += args_info.frame_arg) {
    dumpReader->readFrame(i);

    if (printFrc) forceMan->calcForces();

    // wrapping the molecule
    if (args_info.periodicBox_flag) {
      currentSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
      for (mol = info->beginMolecule(miter); mol != NULL;
           mol = info->nextMolecule(miter)) {
        molCom    = mol->getCom();
        newMolCom = molCom;
        currentSnapshot->wrapVector(newMolCom);
        displacement = newMolCom - molCom;

        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          sd->setPos(sd->getPos() + displacement);
        }
      }
    }

    // update atoms of rigidbody
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
        if (printVel) rb->updateAtomVel();
      }
    }

    // prepare visit
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(prepareVisitor);
      }
    }

    // update visitor
    compositeVisitor->update();

    // visit stuntdouble
    for (mol = info->beginMolecule(miter); mol != NULL;
         mol = info->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        sd->accept(compositeVisitor);
      }
    }

    xyzVisitor->writeFrame(xyzStream);
    xyzVisitor->clear();

  }  // end for (int i = 0; i < nframes; i += args_info.frame_arg)

  xyzStream.close();

  delete forceMan;
  delete compositeVisitor;
  delete prepareVisitor;
  delete dumpReader;

  delete info;
}